

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int getDigits(char *zDate,char *zFormat,...)

{
  char cVar1;
  int iVar2;
  undefined8 *puVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  undefined8 *local_f0;
  undefined8 local_d8 [11];
  va_list ap;
  
  local_f0 = (undefined8 *)&stack0x00000008;
  uVar5 = 0x10;
  iVar2 = 0;
  while( true ) {
    cVar1 = zFormat[3];
    iVar4 = 0;
    for (lVar7 = 0; (byte)(*zFormat - 0x30U) != (byte)lVar7; lVar7 = lVar7 + 1) {
      if ((ulong)(byte)zDate[lVar7] - 0x3a < 0xfffffffffffffff6) {
        return iVar2;
      }
      iVar4 = iVar4 * 10 + (int)zDate[lVar7] + -0x30;
    }
    if (iVar4 < (char)(zFormat[1] + -0x30)) {
      return iVar2;
    }
    if ((int)(uint)(ushort)yy_reduce_ofst[(long)zFormat[2] + 0x149] < iVar4) {
      return iVar2;
    }
    if ((cVar1 != '\0') && (cVar1 != zDate[(byte)(*zFormat - 0x30U)])) break;
    uVar6 = (ulong)uVar5;
    if (uVar6 < 0x29) {
      uVar5 = uVar5 + 8;
      puVar3 = (undefined8 *)((long)local_d8 + uVar6);
    }
    else {
      puVar3 = local_f0;
      local_f0 = local_f0 + 1;
    }
    zDate = zDate + (byte)(*zFormat - 0x30U) + 1;
    iVar2 = iVar2 + 1;
    zFormat = zFormat + 4;
    *(int *)*puVar3 = iVar4;
    if (cVar1 == '\0') {
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

static int getDigits(const char *zDate, const char *zFormat, ...){
  /* The aMx[] array translates the 3rd character of each format
  ** spec into a max size:    a   b   c   d   e     f */
  static const u16 aMx[] = { 12, 14, 24, 31, 59, 9999 };
  va_list ap;
  int cnt = 0;
  char nextC;
  va_start(ap, zFormat);
  do{
    char N = zFormat[0] - '0';
    char min = zFormat[1] - '0';
    int val = 0;
    u16 max;

    assert( zFormat[2]>='a' && zFormat[2]<='f' );
    max = aMx[zFormat[2] - 'a'];
    nextC = zFormat[3];
    val = 0;
    while( N-- ){
      if( !sqlite3Isdigit(*zDate) ){
        goto end_getDigits;
      }
      val = val*10 + *zDate - '0';
      zDate++;
    }
    if( val<(int)min || val>(int)max || (nextC!=0 && nextC!=*zDate) ){
      goto end_getDigits;
    }
    *va_arg(ap,int*) = val;
    zDate++;
    cnt++;
    zFormat += 4;
  }while( nextC );
end_getDigits:
  va_end(ap);
  return cnt;
}